

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void anm_free(anm_archive_t *anm)

{
  list_node_t *__ptr;
  anm_instr_t __ptr_00;
  bool bVar1;
  list_node_t *local_68;
  list_node_t *node_4;
  sprite_t *sprite;
  list_node_t *node_3;
  anm_instr_t *instr;
  list_node_t *node_2;
  anm_script_t *script;
  list_node_t *node_1;
  anm_entry_t *entry;
  list_node_t *node;
  char *name;
  int is_mapped;
  anm_archive_t *anm_local;
  
  bVar1 = anm->map != (uchar *)0x0;
  for (entry = (anm_entry_t *)(anm->names).head; entry != (anm_entry_t *)0x0;
      entry = (anm_entry_t *)entry->header) {
    free(entry->name);
  }
  list_free_nodes(&anm->names);
  script = (anm_script_t *)(anm->entries).head;
  do {
    if (script == (anm_script_t *)0x0) {
      list_free_nodes(&anm->entries);
      if (bVar1) {
        file_munmap(anm->map,anm->map_size);
      }
      free(anm);
      return;
    }
    __ptr = (script->instrs).tail;
    list_free_nodes((list_t *)&__ptr[1].prev);
    for (instr = (anm_instr_t *)__ptr[2].next; instr != (anm_instr_t *)0x0;
        instr = *(anm_instr_t **)instr) {
      __ptr_00 = instr[2];
      if (bVar1) {
        if (*(int *)&__ptr->next[1].data == 0) goto LAB_00105de7;
      }
      else {
        free(*(void **)__ptr_00);
LAB_00105de7:
        for (sprite = *(sprite_t **)((long)__ptr_00 + 8); sprite != (sprite_t *)0x0;
            sprite = *(sprite_t **)sprite) {
          free(*(void **)&sprite->h);
        }
      }
      list_free_nodes((list_t *)((long)__ptr_00 + 8));
      free((void *)__ptr_00);
    }
    list_free_nodes((list_t *)(__ptr + 2));
    if (bVar1) {
      if (6 < *(uint *)&__ptr->next[1].data) {
        free(__ptr->next);
      }
    }
    else {
      free(__ptr->next);
      free(__ptr->prev);
      free(__ptr[1].next);
      free(__ptr[2].data);
      for (local_68 = __ptr[1].prev; local_68 != (list_node_t *)0x0; local_68 = local_68->next) {
        free(local_68->data);
      }
    }
    free(__ptr);
    script = (anm_script_t *)script->offset;
  } while( true );
}

Assistant:

static void
anm_free(
    anm_archive_t* anm)
{
    int is_mapped = anm->map != NULL;

    char* name;
    list_for_each(&anm->names, name)
        free(name);
    list_free_nodes(&anm->names);

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        list_free_nodes(&entry->sprites);

        anm_script_t* script;
        list_for_each(&entry->scripts, script) {
            if (!is_mapped)
                free(script->offset);

            if (!is_mapped || entry->header->version == 0) {
                anm_instr_t* instr;
                list_for_each(&script->instrs, instr) {
                    free(instr);
                }
            }
            list_free_nodes(&script->instrs);

            free(script);
        }
        list_free_nodes(&entry->scripts);

        if (!is_mapped) {
            free(entry->header);
            free(entry->thtx);
            free(entry->name2);
            free(entry->data);

            sprite_t* sprite;
            list_for_each(&entry->sprites, sprite)
                free(sprite);
        } else if (entry->header->version >= 7) {
            free(entry->header);
        }

        free(entry);
    }
    list_free_nodes(&anm->entries);

    if (is_mapped)
        file_munmap(anm->map, anm->map_size);

    free(anm);
}